

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_deref(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  lyxp_set_type lVar1;
  LY_DATA_TYPE LVar2;
  int iVar3;
  lyxp_set *plVar4;
  lysc_node *plVar5;
  lysc_type_leafref *lref;
  ly_bool lVar6;
  LY_ERR LVar7;
  char *pcVar8;
  uint uVar9;
  char *format;
  long lVar10;
  undefined4 uVar11;
  ly_ctx *plVar12;
  undefined8 uVar13;
  lysc_node *plVar14;
  ulong uVar15;
  LY_ERR LVar16;
  ly_set *targets;
  char *errmsg;
  ly_path *p;
  ly_set *local_30;
  char *local_28;
  lyd_node *local_20;
  
  local_28 = (char *)0x0;
  local_30 = (ly_set *)0x0;
  plVar4 = *args;
  lVar1 = plVar4->type;
  if ((options & 0x1c) == 0) {
    if (lVar1 == LYXP_SET_NODE_SET) {
      lyxp_set_free_content(set);
      LVar16 = LY_SUCCESS;
      if ((*args)->used != 0) {
        plVar14 = (((*args)->val).scnodes)->scnode;
        if (((ulong)plVar14->module->ctx & 0xc) != 0) {
          lref = (lysc_type_leafref *)plVar14->module->identities;
          LVar2 = lref->basetype;
          if (LVar2 == LY_TYPE_INST) {
            LVar16 = LY_SUCCESS;
            LVar7 = ly_path_eval((ly_path *)plVar14->priv,set->tree,(lyxp_var *)0x0,&local_20);
            if (LVar7 == LY_SUCCESS) {
              set_insert_node(set,local_20,0,LYXP_NODE_ELEM,0);
            }
            else {
              plVar12 = set->ctx;
              pcVar8 = lyd_get_value((lyd_node *)plVar14);
              LVar16 = LY_EINVAL;
              ly_log(plVar12,LY_LLERR,LY_EINVAL,
                     "Invalid instance-identifier \"%s\" value - required instance not found.",
                     pcVar8);
            }
          }
          else {
            if (LVar2 != LY_TYPE_LEAFREF) {
              __assert_fail("sleaf->type->basetype == LY_TYPE_INST",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xff3,
                            "LY_ERR xpath_deref(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                           );
            }
            LVar7 = lyplg_type_resolve_leafref
                              (lref,(lyd_node *)plVar14,(lyd_value *)&plVar14->ref,set->tree,
                               &local_30,&local_28);
            if (LVar7 == LY_SUCCESS) {
              if (local_30->count != 0) {
                LVar16 = LY_SUCCESS;
                uVar15 = 0;
                do {
                  set_insert_node(set,(local_30->field_2).dnodes[uVar15],0,LYXP_NODE_ELEM,0);
                  uVar15 = uVar15 + 1;
                } while (uVar15 < local_30->count);
              }
            }
            else {
              LVar16 = LY_EINVAL;
              ly_log(set->ctx,LY_LLERR,LY_EINVAL,"%s",local_28);
              free(local_28);
            }
          }
        }
      }
    }
    else {
      if (lVar1 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar13 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar1 * 8);
      }
      else {
        uVar13 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,uVar13,
              "deref(node-set)");
      LVar16 = LY_EVALID;
    }
    goto LAB_001b55f4;
  }
  if (lVar1 == LYXP_SET_SCNODE_SET) {
    uVar9 = plVar4->used;
    plVar14 = (lysc_node *)0x0;
    do {
      uVar9 = uVar9 - 1;
      if (*(int *)((long)(plVar4->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
        plVar14 = *(lysc_node **)((long)(plVar4->val).nodes + (ulong)uVar9 * 0x18);
        break;
      }
    } while (uVar9 != 0);
    if (plVar14 == (lysc_node *)0x0) {
      plVar14 = (lysc_node *)0x0;
    }
    else {
      if ((plVar14->nodetype & 0xc) == 0) {
        plVar12 = set->ctx;
        pcVar8 = lys_nodetype2str(plVar14->nodetype);
        format = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        plVar5 = plVar14[1].parent;
        lVar6 = warn_is_specific_type((lysc_type *)plVar5,LY_TYPE_LEAFREF);
        if ((lVar6 != '\0') ||
           (lVar6 = warn_is_specific_type((lysc_type *)plVar5,LY_TYPE_INST), lVar6 != '\0'))
        goto LAB_001b5553;
        plVar12 = set->ctx;
        pcVar8 = plVar14->name;
        format = 
        "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\".";
      }
      ly_log(plVar12,LY_LLWRN,LY_SUCCESS,format,"xpath_deref",pcVar8);
    }
  }
  else {
    plVar14 = (lysc_node *)0x0;
    ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_deref");
  }
LAB_001b5553:
  uVar9 = set->used;
  if ((ulong)uVar9 != 0) {
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)&((set->val).nodes)->pos + lVar10);
      if (iVar3 == 2) {
        uVar11 = 1;
LAB_001b5583:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = uVar11;
      }
      else if (iVar3 == -2) {
        uVar11 = 0xffffffff;
        goto LAB_001b5583;
      }
      lVar10 = lVar10 + 0x18;
    } while ((ulong)uVar9 * 0x18 != lVar10);
  }
  LVar16 = LY_SUCCESS;
  if (((plVar14 != (lysc_node *)0x0) && (LVar16 = LY_SUCCESS, (plVar14->nodetype & 0xc) != 0)) &&
     (plVar5 = plVar14[1].parent, *(int *)&plVar5->next == 0xe)) {
    LVar16 = LY_SUCCESS;
    LVar7 = ly_path_compile_leafref
                      (set->ctx,plVar14,(lysc_ext_instance *)0x0,(lyxp_expr *)plVar5->prev,
                       ((plVar14->flags >> 0xd & 1) != 0) + 1,0x20,LY_VALUE_SCHEMA_RESOLVED,
                       plVar5->name,(ly_path **)&local_20);
    if (LVar7 == LY_SUCCESS) {
      if (local_20 == (lyd_node *)0x0) {
        lVar10 = -1;
      }
      else {
        lVar10 = (long)local_20[-1].priv + -1;
      }
      plVar14 = *(lysc_node **)((long)&local_20->hash + lVar10 * 3 * 8);
      ly_path_free((ly_path *)local_20);
      LVar16 = LY_SUCCESS;
      LVar7 = lyxp_set_scnode_insert_node(set,plVar14,LYXP_NODE_ELEM,LYXP_AXIS_SELF,(uint32_t *)0x0)
      ;
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
    }
  }
LAB_001b55f4:
  ly_set_free(local_30,(_func_void_void_ptr *)0x0);
  return LVar16;
}

Assistant:

static LY_ERR
xpath_deref(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lyd_node_term *leaf;
    struct lysc_node_leaf *sleaf = NULL;
    struct lysc_type_leafref *lref;
    const struct lysc_node *target;
    struct ly_path *p;
    struct lyd_node *node;
    char *errmsg = NULL;
    uint8_t oper;
    LY_ERR r;
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *targets = NULL;
    uint32_t i;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type != LYXP_SET_SCNODE_SET) {
            LOGWRN(set->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
        } else if ((sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & LYD_NODE_TERM)) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_specific_type(sleaf->type, LY_TYPE_LEAFREF) &&
                    !warn_is_specific_type(sleaf->type, LY_TYPE_INST)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\".",
                        __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        if (sleaf && (sleaf->nodetype & LYD_NODE_TERM) && (sleaf->type->basetype == LY_TYPE_LEAFREF)) {
            lref = (struct lysc_type_leafref *)sleaf->type;
            oper = (sleaf->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT;

            /* it was already evaluated on schema, it must succeed */
            r = ly_path_compile_leafref(set->ctx, &sleaf->node, NULL, lref->path, oper, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &p);
            if (!r) {
                /* get the target node */
                target = p[LY_ARRAY_COUNT(p) - 1].node;
                ly_path_free(p);

                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, target, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
            } /* else the target was found before but is disabled so it was removed */
        }

        ret = LY_SUCCESS;
        goto cleanup;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "deref(node-set)");
        ret = LY_EVALID;
        goto cleanup;
    }

    lyxp_set_free_content(set);
    if (args[0]->used) {
        leaf = (struct lyd_node_term *)args[0]->val.nodes[0].node;
        sleaf = (struct lysc_node_leaf *)leaf->schema;
        if (sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (sleaf->type->basetype == LY_TYPE_LEAFREF) {
                /* find leafref target */
                r = lyplg_type_resolve_leafref((struct lysc_type_leafref *)sleaf->type, &leaf->node, &leaf->value, set->tree,
                        &targets, &errmsg);
                if (r) {
                    LOGERR(set->ctx, LY_EINVAL, "%s", errmsg);
                    free(errmsg);
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert nodes into set */
                for (i = 0; i < targets->count; ++i) {
                    set_insert_node(set, targets->dnodes[i], 0, LYXP_NODE_ELEM, 0);
                }
            } else {
                assert(sleaf->type->basetype == LY_TYPE_INST);
                if (ly_path_eval(leaf->value.target, set->tree, NULL, &node)) {
                    LOGERR(set->ctx, LY_EINVAL, "Invalid instance-identifier \"%s\" value - required instance not found.",
                            lyd_get_value(&leaf->node));
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert it */
                set_insert_node(set, node, 0, LYXP_NODE_ELEM, 0);
            }
        }
    }

cleanup:
    ly_set_free(targets, NULL);
    return ret;
}